

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O1

void test_from_neg<wchar_t>
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *source,
               string *target,string *encoding)

{
  string *psVar1;
  wchar_t *pwVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  wchar_t *pwVar4;
  int iVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  method_type mVar8;
  string *psVar9;
  wchar_t *pwVar10;
  bool bVar11;
  locale l;
  generator g;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [8];
  generator local_f8 [8];
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  booster::locale::generator::generator(local_f8);
  std::operator+(&local_120,"en_US.",encoding);
  booster::locale::generator::generate(local_100);
  paVar3 = &local_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  pwVar10 = (source->_M_dataplus)._M_p;
  mVar8 = (method_type)encoding;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_120,pwVar10,(string *)(pwVar10 + source->_M_string_length),mVar8);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = bcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_120._M_string_length)
      ;
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(source,encoding)==target",0x28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar10 = (source->_M_dataplus)._M_p;
  psVar9 = (string *)(pwVar10 + -1);
  do {
    psVar1 = psVar9 + 4;
    psVar9 = psVar9 + 4;
  } while (*(int *)psVar1 != 0);
  booster::locale::conv::from_utf<wchar_t>((wchar_t *)&local_120,pwVar10,psVar9,mVar8);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = bcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_120._M_string_length)
      ;
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(source.c_str(),encoding)==target",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)&local_120,pwVar10,(string *)(pwVar10 + source->_M_string_length),mVar8);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = bcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_120._M_string_length)
      ;
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               " from_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target",0x4d)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            (&local_120,pwVar10,pwVar10 + source->_M_string_length,(locale *)local_100,
             default_method);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = bcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_120._M_string_length)
      ;
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(source,l)==target",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar4 = (source->_M_dataplus)._M_p;
  pwVar10 = pwVar4 + -1;
  do {
    pwVar2 = pwVar10 + 1;
    pwVar10 = pwVar10 + 1;
  } while (*pwVar2 != L'\0');
  booster::locale::conv::from_utf<wchar_t>
            (&local_120,pwVar4,pwVar10,(locale *)local_100,default_method);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = bcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_120._M_string_length)
      ;
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(source.c_str(),l)==target",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            (&local_120,pwVar10,pwVar10 + source->_M_string_length,(locale *)local_100,
             default_method);
  if (local_120._M_string_length == target->_M_string_length) {
    if (local_120._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar5 = bcmp(local_120._M_dataplus._M_p,(target->_M_dataplus)._M_p,local_120._M_string_length)
      ;
      bVar11 = iVar5 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar3) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xea);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target",0x46)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar5 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar5;
    if (bVar11) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_120._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_120);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar10 = (source->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)local_50,pwVar10,(string *)(pwVar10 + source->_M_string_length),mVar8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xec);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," from_utf<Char>(source,encoding,stop)",0x25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  pwVar10 = (source->_M_dataplus)._M_p;
  psVar9 = (string *)(pwVar10 + -1);
  do {
    psVar1 = psVar9 + 4;
    psVar9 = psVar9 + 4;
  } while (*(int *)psVar1 != 0);
  error_counter = error_counter + 1;
  booster::locale::conv::from_utf<wchar_t>((wchar_t *)local_70,pwVar10,psVar9,mVar8);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xed);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," from_utf<Char>(source.c_str(),encoding,stop)",0x2d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  pwVar10 = (source->_M_dataplus)._M_p;
  error_counter = error_counter + 1;
  booster::locale::conv::from_utf<wchar_t>
            ((wchar_t *)local_90,pwVar10,(string *)(pwVar10 + source->_M_string_length),mVar8);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xee);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," from_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop)",
             0x4a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  pwVar10 = (source->_M_dataplus)._M_p;
  error_counter = error_counter + 1;
  booster::locale::conv::from_utf<wchar_t>
            (&local_b0,pwVar10,pwVar10 + source->_M_string_length,(locale *)local_100,stop);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xef);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," from_utf<Char>(source,l,stop)",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (0x14 < error_counter) {
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  test_counter = test_counter + 1;
  pwVar4 = (source->_M_dataplus)._M_p;
  pwVar10 = pwVar4 + -1;
  do {
    pwVar2 = pwVar10 + 1;
    pwVar10 = pwVar10 + 1;
  } while (*pwVar2 != L'\0');
  error_counter = error_counter + 1;
  booster::locale::conv::from_utf<wchar_t>(&local_d0,pwVar4,pwVar10,(locale *)local_100,stop);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6," from_utf<Char>(source.c_str(),l,stop)",0x26);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (error_counter < 0x15) {
    test_counter = test_counter + 1;
    pwVar10 = (source->_M_dataplus)._M_p;
    error_counter = error_counter + 1;
    booster::locale::conv::from_utf<wchar_t>
              (&local_f0,pwVar10,pwVar10 + source->_M_string_length,(locale *)local_100,stop);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop)",0x43);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (error_counter < 0x15) {
      error_counter = error_counter + 1;
      std::locale::~locale((locale *)local_100);
      booster::locale::generator::~generator(local_f8);
      return;
    }
    error_counter = error_counter + 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_120._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Error limits reached, stopping unit test","");
    booster::runtime_error::runtime_error(prVar7,&local_120);
    __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  error_counter = error_counter + 1;
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_120._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"Error limits reached, stopping unit test","");
  booster::runtime_error::runtime_error(prVar7,&local_120);
  __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_from_neg(std::basic_string<Char> source,std::string target,std::string encoding)
{
    using namespace booster::locale::conv;
    booster::locale::generator g;
    std::locale l=g("en_US."+encoding);

    TEST(from_utf<Char>(source,encoding)==target);
    TEST(from_utf<Char>(source.c_str(),encoding)==target);
    TEST(from_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding)==target);
    TEST(from_utf<Char>(source,l)==target);
    TEST(from_utf<Char>(source.c_str(),l)==target);
    TEST(from_utf<Char>(source.c_str(),source.c_str()+source.size(),l)==target);

    TESTF(from_utf<Char>(source,encoding,stop));
    TESTF(from_utf<Char>(source.c_str(),encoding,stop));
    TESTF(from_utf<Char>(source.c_str(),source.c_str()+source.size(),encoding,stop));
    TESTF(from_utf<Char>(source,l,stop));
    TESTF(from_utf<Char>(source.c_str(),l,stop));
    TESTF(from_utf<Char>(source.c_str(),source.c_str()+source.size(),l,stop));
}